

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall ByteCodeGenerator::LoadAllConstants(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  code *pcVar1;
  anon_class_24_3_2ea546c2 fn;
  anon_class_24_3_2ea546c2 fn_00;
  bool bVar2;
  RegSlot RVar3;
  uint32 uVar4;
  BOOL BVar5;
  RegSlot value;
  uint uVar6;
  PropertyId PVar7;
  Scope *pSVar8;
  Recycler *pRVar9;
  PropertyIdArray *this_00;
  Symbol *pSVar10;
  undefined4 *puVar11;
  FunctionBody *pFVar12;
  CharacterBuffer<char16_t> *propName;
  bool local_171;
  RegSlot scopeLocation;
  RegSlot ldFuncExprDst;
  bool funcExprWithName;
  TrackAllocData local_b0;
  PropertyIdArray *local_88;
  PropertyIdArray *propIds;
  FunctionBody *pFStack_78;
  uint count_1;
  byte local_69;
  uint local_68;
  uint uStack_64;
  bool thisLoadedFromParams;
  int paramSlotCount;
  int scopeSlotCount;
  Symbol **local_58;
  uint *local_50;
  ByteCodeGenerator *local_48;
  Symbol **local_40;
  uint *local_38;
  uint local_2c;
  anon_class_8_1_3e9b088b_for_fn aStack_28;
  uint count;
  FunctionBody *byteCodeFunction;
  Symbol *sym;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *this_local;
  
  sym = (Symbol *)funcInfo;
  funcInfo_local = (FuncInfo *)this;
  aStack_28.byteCodeFunction = FuncInfo::GetParsedFunctionBody(funcInfo);
  Js::FunctionBody::CreateConstantTable(aStack_28.byteCodeFunction);
  pFVar12 = aStack_28.byteCodeFunction;
  if (*(int *)&sym[1].scope != -1) {
    RVar3 = Js::FunctionBody::MapRegSlot(aStack_28.byteCodeFunction,*(RegSlot *)&sym[1].scope);
    Js::FunctionBody::RecordNullObject(pFVar12,RVar3);
  }
  pFVar12 = aStack_28.byteCodeFunction;
  if (*(int *)((long)&sym[1].scope + 4) != -1) {
    RVar3 = Js::FunctionBody::MapRegSlot
                      (aStack_28.byteCodeFunction,*(RegSlot *)((long)&sym[1].scope + 4));
    Js::FunctionBody::RecordUndefinedObject(pFVar12,RVar3);
  }
  pFVar12 = aStack_28.byteCodeFunction;
  if (sym[1].position != -1) {
    RVar3 = Js::FunctionBody::MapRegSlot(aStack_28.byteCodeFunction,sym[1].position);
    Js::FunctionBody::RecordTrueObject(pFVar12,RVar3);
  }
  pFVar12 = aStack_28.byteCodeFunction;
  if (sym[1].location != 0xffffffff) {
    RVar3 = Js::FunctionBody::MapRegSlot(aStack_28.byteCodeFunction,sym[1].location);
    Js::FunctionBody::RecordFalseObject(pFVar12,RVar3);
  }
  if (*(int *)&sym[1].next == -1) {
    if (*(int *)((long)&sym[1].next + 4) != -1) {
      uStack_64 = Scope::GetScopeSlotCount(*(Scope **)&sym[5].assignmentState);
      local_68 = Scope::GetScopeSlotCount(*(Scope **)&sym[5].symbolType);
      if ((uStack_64 == 0) && (local_68 == 0)) {
        if (*(int *)&sym[1].field_0x44 == -1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x79c,"(funcInfo->frameDisplayRegister != Js::Constants::NoRegister)",
                             "Why do we need scope slots?");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 0;
        }
        Js::ByteCodeWriter::Reg1(&this->m_writer,LdC_A_Null,*(RegSlot *)((long)&sym[1].next + 4));
      }
    }
  }
  else {
    Js::ByteCodeWriter::RecordObjectRegister(&this->m_writer,*(RegSlot *)&sym[1].next);
    bVar2 = FuncInfo::GetApplyEnclosesArgs((FuncInfo *)sym);
    if (!bVar2) {
      EmitScopeObjectInit(this,(FuncInfo *)sym);
    }
    local_2c = 0;
    pSVar8 = FuncInfo::GetBodyScope((FuncInfo *)sym);
    local_40 = &sym;
    local_38 = &local_2c;
    fn.funcInfo = (FuncInfo **)local_40;
    fn.this = this;
    fn.count = local_38;
    local_48 = this;
    Scope::ForEachSymbol<ByteCodeGenerator::LoadAllConstants(FuncInfo*)::__0>(pSVar8,fn);
    pSVar8 = FuncInfo::GetParamScope((FuncInfo *)sym);
    if (pSVar8 != (Scope *)0x0) {
      pSVar8 = FuncInfo::GetParamScope((FuncInfo *)sym);
      local_58 = &sym;
      local_50 = &local_2c;
      fn_00.funcInfo = (FuncInfo **)local_58;
      fn_00.this = this;
      fn_00.count = local_50;
      _paramSlotCount = this;
      Scope::ForEachSymbol<ByteCodeGenerator::LoadAllConstants(FuncInfo*)::__1>(pSVar8,fn_00);
    }
    bVar2 = Js::ParseableFunctionInfo::IsReparsed
                      (&(aStack_28.byteCodeFunction)->super_ParseableFunctionInfo);
    if ((((bVar2) &&
         (bVar2 = Js::FunctionBody::HasGeneratedFromByteCodeCache(aStack_28.byteCodeFunction),
         !bVar2)) &&
        (((aStack_28.byteCodeFunction)->super_ParseableFunctionInfo).scopeObjectSize != local_2c))
       && (bVar2 = Js::ParseableFunctionInfo::WasEverAsmJsMode
                             (&(aStack_28.byteCodeFunction)->super_ParseableFunctionInfo), !bVar2))
    {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x792,
                         "(!byteCodeFunction->IsReparsed() || byteCodeFunction->HasGeneratedFromByteCodeCache() || byteCodeFunction->scopeObjectSize == count || byteCodeFunction->WasEverAsmJsMode())"
                         ,"The activation object size is different between debug and non-debug mode"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    ((aStack_28.byteCodeFunction)->super_ParseableFunctionInfo).scopeObjectSize = local_2c;
  }
  if ((sym[6].name.string.ptr != (char16_t *)0x0) &&
     (bVar2 = Scope::GetIsObject((Scope *)sym[6].name.string.ptr),
     pFVar12 = aStack_28.byteCodeFunction, bVar2)) {
    RVar3 = Scope::GetLocation((Scope *)sym[6].name.string.ptr);
    Js::FunctionBody::MapAndSetFuncExprScopeRegister(pFVar12,RVar3);
    Js::FunctionBody::SetEnvDepth(aStack_28.byteCodeFunction,0xffff);
  }
  local_69 = 0;
  bVar2 = FuncInfo::NeedEnvRegister((FuncInfo *)sym);
  pFVar12 = aStack_28.byteCodeFunction;
  if (bVar2) {
    RVar3 = FuncInfo::GetEnvRegister((FuncInfo *)sym);
    Js::FunctionBody::MapAndSetEnvRegister(pFVar12,RVar3);
    bVar2 = FuncInfo::GetIsTopLevelEventHandler((FuncInfo *)sym);
    if (bVar2) {
      pSVar10 = FuncInfo::GetThisSymbol((FuncInfo *)sym);
      pFVar12 = aStack_28.byteCodeFunction;
      if (pSVar10 != (Symbol *)0x0) {
        pSVar10 = FuncInfo::GetThisSymbol((FuncInfo *)sym);
        RVar3 = Symbol::GetLocation(pSVar10);
        Js::FunctionBody::MapAndSetThisRegisterForEventHandler(pFVar12,RVar3);
      }
      pSVar10 = sym;
      RVar3 = FuncInfo::GetEnvRegister((FuncInfo *)sym);
      bVar2 = FuncInfo::RegIsConst((FuncInfo *)pSVar10,RVar3);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x7b3,"(!funcInfo->RegIsConst(funcInfo->GetEnvRegister()))",
                           "!funcInfo->RegIsConst(funcInfo->GetEnvRegister())");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 0;
      }
      local_69 = 1;
      InvalidateCachedOuterScopes(this,(FuncInfo *)sym);
    }
    else {
      bVar2 = FuncInfo::IsGlobalFunction((FuncInfo *)sym);
      pSVar10 = sym;
      if ((bVar2) && ((this->flags & 0x400) == 0)) {
        RVar3 = FuncInfo::GetEnvRegister((FuncInfo *)sym);
        bVar2 = FuncInfo::RegIsConst((FuncInfo *)pSVar10,RVar3);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x7b9,"(funcInfo->RegIsConst(funcInfo->GetEnvRegister()))",
                             "funcInfo->RegIsConst(funcInfo->GetEnvRegister())");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 0;
        }
        bVar2 = FuncInfo::GetIsStrictMode((FuncInfo *)sym);
        pFVar12 = aStack_28.byteCodeFunction;
        if (bVar2) {
          RVar3 = FuncInfo::GetEnvRegister((FuncInfo *)sym);
          RVar3 = Js::FunctionBody::MapRegSlot(pFVar12,RVar3);
          Js::FunctionBody::RecordStrictNullDisplayConstant(pFVar12,RVar3);
        }
        else {
          RVar3 = FuncInfo::GetEnvRegister((FuncInfo *)sym);
          RVar3 = Js::FunctionBody::MapRegSlot(pFVar12,RVar3);
          Js::FunctionBody::RecordNullDisplayConstant(pFVar12,RVar3);
        }
      }
      else {
        RVar3 = FuncInfo::GetEnvRegister((FuncInfo *)sym);
        bVar2 = FuncInfo::RegIsConst((FuncInfo *)pSVar10,RVar3);
        if (bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x7c7,"(!funcInfo->RegIsConst(funcInfo->GetEnvRegister()))",
                             "!funcInfo->RegIsConst(funcInfo->GetEnvRegister())");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 0;
        }
        InvalidateCachedOuterScopes(this,(FuncInfo *)sym);
      }
    }
  }
  if (*(int *)&sym[1].field_0x44 != -1) {
    Js::ByteCodeWriter::RecordFrameDisplayRegister(&this->m_writer,*(RegSlot *)&sym[1].field_0x44);
  }
  RecordAllIntConstants(this,(FuncInfo *)sym);
  RecordAllStrConstants(this,(FuncInfo *)sym);
  RecordAllBigIntConstants(this,(FuncInfo *)sym);
  RecordAllStringTemplateCallsiteConstants(this,(FuncInfo *)sym);
  pFStack_78 = aStack_28.byteCodeFunction;
  JsUtil::
  BaseDictionary<double,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::Map<ByteCodeGenerator::LoadAllConstants(FuncInfo*)::__2>
            ((BaseDictionary<double,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)&sym[3].next,aStack_28);
  bVar2 = FuncInfo::GetHasArguments((FuncInfo *)sym);
  if (bVar2) {
    byteCodeFunction = (FunctionBody *)FuncInfo::GetArgumentsSymbol((FuncInfo *)sym);
    if (byteCodeFunction == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x7e3,"(sym)","sym");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    bVar2 = FuncInfo::GetHasHeapArguments((FuncInfo *)sym);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x7e4,"(funcInfo->GetHasHeapArguments())",
                         "funcInfo->GetHasHeapArguments()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    bVar2 = FuncInfo::GetCallsEval((FuncInfo *)sym);
    if ((bVar2) || (bVar2 = FuncInfo::GetApplyEnclosesArgs((FuncInfo *)sym), !bVar2)) {
      LoadHeapArguments(this,(FuncInfo *)sym);
    }
  }
  else {
    bVar2 = FuncInfo::IsGlobalFunction((FuncInfo *)sym);
    if (((!bVar2) && (bVar2 = IsInNonDebugMode(this), !bVar2)) &&
       (propIds._4_4_ =
             ((uint)*(ushort *)&sym[1].name.string.ptr +
             (uint)(*(long *)(*(long *)&sym[6].name.len + 0x60) != 0)) - 1, propIds._4_4_ != 0)) {
      pRVar9 = Js::ScriptContext::GetRecycler(this->scriptContext);
      uVar4 = UInt32Math::Mul(propIds._4_4_,4);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_b0,(type_info *)&Js::PropertyIdArray::typeinfo,(ulong)uVar4,
                 0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                 ,0x7f1);
      pRVar9 = Memory::Recycler::TrackAllocInfo(pRVar9,&local_b0);
      UInt32Math::Mul(propIds._4_4_,4);
      this_00 = (PropertyIdArray *)new<Memory::Recycler>(8,pRVar9,0x446fd0,0);
      Js::PropertyIdArray::PropertyIdArray(this_00,propIds._4_4_,'\0',false,false,false);
      local_88 = this_00;
      GetFormalArgsArray(this,(FuncInfo *)sym,this_00);
      Js::FunctionBody::SetPropertyIdsOfFormals(aStack_28.byteCodeFunction,local_88);
    }
  }
  BVar5 = FuncInfo::IsClassConstructor((FuncInfo *)sym);
  if (BVar5 != 0) {
    Js::ByteCodeWriter::Empty(&this->m_writer,ChkNewCallFlag);
  }
  pSVar10 = FuncInfo::GetNewTargetSymbol((FuncInfo *)sym);
  if (pSVar10 != (Symbol *)0x0) {
    LoadNewTargetObject(this,(FuncInfo *)sym);
  }
  pSVar10 = FuncInfo::GetThisSymbol((FuncInfo *)sym);
  if (pSVar10 == (Symbol *)0x0) {
    bVar2 = ShouldLoadConstThis(this,(FuncInfo *)sym);
    if (bVar2) {
      EmitThis(this,(FuncInfo *)sym,sym[1].scopeSlot,*(RegSlot *)&sym[1].scope);
    }
  }
  else {
    LoadThisObject(this,(FuncInfo *)sym,(bool)(local_69 & 1));
  }
  pSVar10 = FuncInfo::GetSuperSymbol((FuncInfo *)sym);
  if (pSVar10 != (Symbol *)0x0) {
    LoadSuperObject(this,(FuncInfo *)sym);
  }
  pSVar10 = FuncInfo::GetSuperConstructorSymbol((FuncInfo *)sym);
  if (pSVar10 != (Symbol *)0x0) {
    LoadSuperConstructorObject(this,(FuncInfo *)sym);
  }
  pSVar10 = FuncInfo::GetImportMetaSymbol((FuncInfo *)sym);
  if (pSVar10 != (Symbol *)0x0) {
    LoadImportMetaObject(this,(FuncInfo *)sym);
  }
  byteCodeFunction = (FunctionBody *)ParseNodeFnc::GetFuncSymbol(*(ParseNodeFnc **)&sym[6].name.len)
  ;
  bVar2 = FuncInfo::IsGlobalFunction((FuncInfo *)sym);
  local_171 = false;
  if ((!bVar2) && (local_171 = false, byteCodeFunction != (FunctionBody *)0x0)) {
    local_171 = Symbol::GetIsFuncExpr((Symbol *)byteCodeFunction);
  }
  if ((local_171 != false) &&
     ((bVar2 = FuncInfo::GetFuncExprNameReference((FuncInfo *)sym), bVar2 ||
      ((sym[6].name.string.ptr != (char16_t *)0x0 &&
       (bVar2 = Scope::GetIsObject((Scope *)sym[6].name.string.ptr), bVar2)))))) {
    RVar3 = Symbol::GetLocation((Symbol *)byteCodeFunction);
    Js::ByteCodeWriter::Reg1(&this->m_writer,LdFuncExpr,RVar3);
    bVar2 = Symbol::IsInSlot((Symbol *)byteCodeFunction,this,(FuncInfo *)sym,false);
    if (bVar2) {
      if (sym[6].name.string.ptr == (char16_t *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x839,"(funcInfo->funcExprScope)","funcInfo->funcExprScope");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 0;
      }
      bVar2 = Scope::GetIsObject((Scope *)sym[6].name.string.ptr);
      if (bVar2) {
        RVar3 = Scope::GetLocation((Scope *)sym[6].name.string.ptr);
        value = Symbol::GetLocation((Symbol *)byteCodeFunction);
        pSVar10 = sym;
        PVar7 = Symbol::GetPosition((Symbol *)byteCodeFunction);
        uVar6 = FuncInfo::FindOrAddReferencedPropertyId((FuncInfo *)pSVar10,PVar7);
        Js::ByteCodeWriter::Property(&this->m_writer,StFuncExpr,value,RVar3,uVar6,false);
      }
      else {
        bVar2 = Scope::GetIsObject(*(Scope **)&sym[5].symbolType);
        if ((bVar2) ||
           ((bVar2 = Scope::GetCanMerge(*(Scope **)&sym[5].symbolType), bVar2 &&
            (bVar2 = Scope::GetIsObject(*(Scope **)&sym[5].assignmentState), bVar2)))) {
          RVar3 = Symbol::GetLocation((Symbol *)byteCodeFunction);
          pSVar10 = sym;
          PVar7 = Symbol::GetPosition((Symbol *)byteCodeFunction);
          uVar6 = FuncInfo::FindOrAddReferencedPropertyId((FuncInfo *)pSVar10,PVar7);
          Js::ByteCodeWriter::ElementU(&this->m_writer,StLocalFuncExpr,RVar3,uVar6);
        }
        else {
          bVar2 = Symbol::HasScopeSlot((Symbol *)byteCodeFunction);
          if (!bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0x848,"(sym->HasScopeSlot())","sym->HasScopeSlot()");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 0;
          }
          RVar3 = Symbol::GetLocation((Symbol *)byteCodeFunction);
          PVar7 = Symbol::GetScopeSlot((Symbol *)byteCodeFunction);
          Js::ByteCodeWriter::SlotI1(&this->m_writer,StLocalSlot,RVar3,PVar7 + 2);
        }
      }
    }
    else {
      bVar2 = ShouldTrackDebuggerMetadata(this);
      if (bVar2) {
        pFVar12 = Js::FunctionProxy::GetFunctionBody((FunctionProxy *)sym[6].pid);
        propName = Symbol::GetName((Symbol *)byteCodeFunction);
        RVar3 = Symbol::GetLocation((Symbol *)byteCodeFunction);
        Js::FunctionBody::InsertSymbolToRegSlotList
                  (pFVar12,propName,RVar3,*(RegSlot *)&sym->assignmentState);
      }
    }
  }
  return;
}

Assistant:

void ByteCodeGenerator::LoadAllConstants(FuncInfo *funcInfo)
{
    Symbol *sym;

    Js::FunctionBody *byteCodeFunction = funcInfo->GetParsedFunctionBody();
    byteCodeFunction->CreateConstantTable();

    if (funcInfo->nullConstantRegister != Js::Constants::NoRegister)
    {
        byteCodeFunction->RecordNullObject(byteCodeFunction->MapRegSlot(funcInfo->nullConstantRegister));
    }

    if (funcInfo->undefinedConstantRegister != Js::Constants::NoRegister)
    {
        byteCodeFunction->RecordUndefinedObject(byteCodeFunction->MapRegSlot(funcInfo->undefinedConstantRegister));
    }

    if (funcInfo->trueConstantRegister != Js::Constants::NoRegister)
    {
        byteCodeFunction->RecordTrueObject(byteCodeFunction->MapRegSlot(funcInfo->trueConstantRegister));
    }

    if (funcInfo->falseConstantRegister != Js::Constants::NoRegister)
    {
        byteCodeFunction->RecordFalseObject(byteCodeFunction->MapRegSlot(funcInfo->falseConstantRegister));
    }

    if (funcInfo->frameObjRegister != Js::Constants::NoRegister)
    {
        m_writer.RecordObjectRegister(funcInfo->frameObjRegister);
        if (!funcInfo->GetApplyEnclosesArgs())
        {
            this->EmitScopeObjectInit(funcInfo);
        }

#if DBG
        uint count = 0;
        funcInfo->GetBodyScope()->ForEachSymbol([&](Symbol *const sym)
        {
            if (sym->NeedsSlotAlloc(this, funcInfo))
            {
                // All properties should get correct propertyId here.
                count++;
            }
        });

        if (funcInfo->GetParamScope() != nullptr)
        {
            funcInfo->GetParamScope()->ForEachSymbol([&](Symbol *const sym)
            {
                if (sym->NeedsSlotAlloc(this, funcInfo))
                {
                    // All properties should get correct propertyId here.
                    count++;
                }
            });
        }

        // A reparse should result in the same size of the activation object.
        // Exclude functions which were created from the ByteCodeCache.
        AssertMsg(!byteCodeFunction->IsReparsed() || byteCodeFunction->HasGeneratedFromByteCodeCache() ||
            byteCodeFunction->scopeObjectSize == count || byteCodeFunction->WasEverAsmJsMode(),
            "The activation object size is different between debug and non-debug mode");
        byteCodeFunction->scopeObjectSize = count;
#endif
    }
    else if (funcInfo->frameSlotsRegister != Js::Constants::NoRegister)
    {
        int scopeSlotCount = funcInfo->bodyScope->GetScopeSlotCount();
        int paramSlotCount = funcInfo->paramScope->GetScopeSlotCount();
        if (scopeSlotCount == 0 && paramSlotCount == 0)
        {
            AssertMsg(funcInfo->frameDisplayRegister != Js::Constants::NoRegister, "Why do we need scope slots?");
            m_writer.Reg1(Js::OpCode::LdC_A_Null, funcInfo->frameSlotsRegister);
        }
    }

    if (funcInfo->funcExprScope && funcInfo->funcExprScope->GetIsObject())
    {
        byteCodeFunction->MapAndSetFuncExprScopeRegister(funcInfo->funcExprScope->GetLocation());
        byteCodeFunction->SetEnvDepth((uint16)-1);
    }

    bool thisLoadedFromParams = false;

    if (funcInfo->NeedEnvRegister())
    {
        byteCodeFunction->MapAndSetEnvRegister(funcInfo->GetEnvRegister());
        if (funcInfo->GetIsTopLevelEventHandler())
        {
            if (funcInfo->GetThisSymbol())
            {
                byteCodeFunction->MapAndSetThisRegisterForEventHandler(funcInfo->GetThisSymbol()->GetLocation());
            }
            // The environment is the namespace hierarchy starting with "this".
            Assert(!funcInfo->RegIsConst(funcInfo->GetEnvRegister()));
            thisLoadedFromParams = true;
            this->InvalidateCachedOuterScopes(funcInfo);
        }
        else if (funcInfo->IsGlobalFunction() && !(this->flags & fscrEval))
        {
            Assert(funcInfo->RegIsConst(funcInfo->GetEnvRegister()));

            if (funcInfo->GetIsStrictMode())
            {
                byteCodeFunction->RecordStrictNullDisplayConstant(byteCodeFunction->MapRegSlot(funcInfo->GetEnvRegister()));
            }
            else
            {
                byteCodeFunction->RecordNullDisplayConstant(byteCodeFunction->MapRegSlot(funcInfo->GetEnvRegister()));
            }
        }
        else
        {
            // environment may be required to load "this"
            Assert(!funcInfo->RegIsConst(funcInfo->GetEnvRegister()));
            this->InvalidateCachedOuterScopes(funcInfo);
        }
    }

    if (funcInfo->frameDisplayRegister != Js::Constants::NoRegister)
    {
        m_writer.RecordFrameDisplayRegister(funcInfo->frameDisplayRegister);
    }

    this->RecordAllIntConstants(funcInfo);
    this->RecordAllStrConstants(funcInfo);
    this->RecordAllBigIntConstants(funcInfo);
    this->RecordAllStringTemplateCallsiteConstants(funcInfo);

    funcInfo->doubleConstantToRegister.Map([byteCodeFunction](double d, Js::RegSlot location)
    {
        byteCodeFunction->RecordFloatConstant(byteCodeFunction->MapRegSlot(location), d);
    });

    // WARNING !!!
    // DO NOT emit any bytecode before loading the heap arguments. This is because those opcodes may bail 
    // out (unlikely, since opcodes emitted in this function should not correspond to user code, but possible)
    // and the Jit assumes that there cannot be any bailouts before LdHeapArguments (or its equivalent)

    if (funcInfo->GetHasArguments())
    {
        sym = funcInfo->GetArgumentsSymbol();
        Assert(sym);
        Assert(funcInfo->GetHasHeapArguments());

        if (funcInfo->GetCallsEval() || (!funcInfo->GetApplyEnclosesArgs()))
        {
            this->LoadHeapArguments(funcInfo);
        }

    }
    else if (!funcInfo->IsGlobalFunction() && !IsInNonDebugMode())
    {
        uint count = funcInfo->inArgsCount + (funcInfo->root->pnodeRest != nullptr ? 1 : 0) - 1;
        if (count != 0)
        {
            Js::PropertyIdArray *propIds = RecyclerNewPlus(scriptContext->GetRecycler(), UInt32Math::Mul(count, sizeof(Js::PropertyId)), Js::PropertyIdArray, count, 0);

            GetFormalArgsArray(this, funcInfo, propIds);
            byteCodeFunction->SetPropertyIdsOfFormals(propIds);
        }
    }

    // Class constructors do not have a [[call]] slot but we don't implement a generic way to express this.
    // What we do is emit a check for the new flag here. If we don't have CallFlags_New set, the opcode will throw.
    // We need to do this before emitting 'this' since the base class constructor will try to construct a new object.
    if (funcInfo->IsClassConstructor())
    {
        m_writer.Empty(Js::OpCode::ChkNewCallFlag);
    }

    // new.target may be used to construct the 'this' register so make sure to load it first
    if (funcInfo->GetNewTargetSymbol())
    {
        this->LoadNewTargetObject(funcInfo);
    }

    if (funcInfo->GetThisSymbol())
    {
        this->LoadThisObject(funcInfo, thisLoadedFromParams);
    }
    else if (ShouldLoadConstThis(funcInfo))
    {
        this->EmitThis(funcInfo, funcInfo->thisConstantRegister, funcInfo->nullConstantRegister);
    }

    if (funcInfo->GetSuperSymbol())
    {
        this->LoadSuperObject(funcInfo);
    }

    if (funcInfo->GetSuperConstructorSymbol())
    {
        this->LoadSuperConstructorObject(funcInfo);
    }

    if (funcInfo->GetImportMetaSymbol())
    {
        this->LoadImportMetaObject(funcInfo);
    }

    //
    // If the function is a function expression with a name,
    // load the function object at runtime to its activation object.
    //
    sym = funcInfo->root->GetFuncSymbol();
    bool funcExprWithName = !funcInfo->IsGlobalFunction() && sym && sym->GetIsFuncExpr();

    if (funcExprWithName)
    {
        if (funcInfo->GetFuncExprNameReference() ||
            (funcInfo->funcExprScope && funcInfo->funcExprScope->GetIsObject()))
        {
            //
            // x = function f(...) { ... }
            // A named function expression's name (Symbol:f) belongs to the enclosing scope.
            // Thus there are no uses of 'f' within the scope of the function (as references to 'f'
            // are looked up in the closure). So, we can't use f's register as it is from the enclosing
            // scope's register namespace. So use a tmp register.
            // In ES5 mode though 'f' is *not* a part of the enclosing scope. So we always assign 'f' a register
            // from it's register namespace, which LdFuncExpr can use.
            //
            Js::RegSlot ldFuncExprDst = sym->GetLocation();
            this->m_writer.Reg1(Js::OpCode::LdFuncExpr, ldFuncExprDst);

            if (sym->IsInSlot(this, funcInfo))
            {
                Js::RegSlot scopeLocation;
                AnalysisAssert(funcInfo->funcExprScope);

                if (funcInfo->funcExprScope->GetIsObject())
                {
                    scopeLocation = funcInfo->funcExprScope->GetLocation();
                    this->m_writer.Property(Js::OpCode::StFuncExpr, sym->GetLocation(), scopeLocation,
                        funcInfo->FindOrAddReferencedPropertyId(sym->GetPosition()));
                }
                else if (funcInfo->paramScope->GetIsObject() || (funcInfo->paramScope->GetCanMerge() && funcInfo->bodyScope->GetIsObject()))
                {
                    this->m_writer.ElementU(Js::OpCode::StLocalFuncExpr, sym->GetLocation(),
                        funcInfo->FindOrAddReferencedPropertyId(sym->GetPosition()));
                }
                else
                {
                    Assert(sym->HasScopeSlot());
                    this->m_writer.SlotI1(Js::OpCode::StLocalSlot, sym->GetLocation(),
                                          sym->GetScopeSlot() + Js::ScopeSlots::FirstSlotIndex);
                }
            }
            else if (ShouldTrackDebuggerMetadata())
            {
                funcInfo->byteCodeFunction->GetFunctionBody()->InsertSymbolToRegSlotList(sym->GetName(), sym->GetLocation(), funcInfo->varRegsCount);
            }
        }
    }
}